

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void gen_var_dimens(FMFormat_conflict fmformat,int field)

{
  long lVar1;
  bool bVar2;
  FMdata_type FVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int in_ESI;
  long in_RDI;
  int static_size;
  int control_val;
  FMTypeDesc *desc;
  FMTypeDesc *last;
  FMTypeDesc *tmp;
  FMDimen *dimens;
  int done;
  int dimen_count;
  char *typ;
  FMVarInfoList new_var_list;
  FMFieldList field_list;
  int in_stack_000003dc;
  int *in_stack_000003e0;
  int in_stack_000003ec;
  FMFieldList in_stack_000003f0;
  char *in_stack_000003f8;
  int in_stack_ffffffffffffffac;
  FMFormat_conflict in_stack_ffffffffffffffb0;
  long *local_48;
  long *local_40;
  char *str;
  int local_2c;
  
  lVar1 = *(long *)(in_RDI + 0x80);
  pcVar6 = *(char **)(*(long *)(in_RDI + 0x78) + (long)in_ESI * 0x18 + 8);
  local_2c = 0;
  bVar2 = false;
  str = (char *)0x0;
  pcVar5 = strchr(pcVar6,0x2a);
  if ((pcVar5 == (char *)0x0) && (pcVar6 = strchr(pcVar6,0x5b), pcVar6 == (char *)0x0)) {
    *(undefined8 *)(lVar1 + (long)in_ESI * 0x40 + 0x20) = 0;
    *(undefined4 *)(lVar1 + (long)in_ESI * 0x40 + 0x28) = 4;
    *(int *)(lVar1 + (long)in_ESI * 0x40 + 0x34) = in_ESI;
    FVar3 = FMstr_to_data_type(str);
    *(FMdata_type *)(lVar1 + (long)in_ESI * 0x40 + 0x2c) = FVar3;
  }
  else {
    in_stack_ffffffffffffffb0 =
         (FMFormat_conflict)
         gen_type_desc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)0x1297db);
    lVar7 = lVar1 + (long)in_ESI * 0x40;
    *(undefined8 *)(lVar7 + 0x20) = *(undefined8 *)in_stack_ffffffffffffffb0;
    *(FMContext_conflict *)(lVar7 + 0x28) = in_stack_ffffffffffffffb0->context;
    *(char **)(lVar7 + 0x30) = in_stack_ffffffffffffffb0->format_name;
    *(undefined8 *)(lVar7 + 0x38) = *(undefined8 *)&in_stack_ffffffffffffffb0->format_index;
    free(in_stack_ffffffffffffffb0);
  }
  local_48 = (long *)0x0;
  for (local_40 = (long *)(lVar1 + (long)in_ESI * 0x40 + 0x20); *local_40 != 0;
      local_40 = (long *)*local_40) {
    if ((int)local_40[1] == 0) {
      *(undefined4 *)(in_RDI + 0x48) = 1;
    }
    local_48 = local_40;
  }
  if (*(int *)(lVar1 + (long)in_ESI * 0x40 + 0xc) == 5) {
    *(undefined4 *)(local_40 + 1) = 2;
  }
  else if (*(long *)(*(long *)(in_RDI + 0x88) + (long)in_ESI * 8) != 0) {
    *(undefined4 *)(local_40 + 1) = 3;
    *(int *)((long)local_40 + 0x14) = in_ESI;
    if ((*(int *)(*(long *)(*(long *)(in_RDI + 0x88) + (long)in_ESI * 8) + 0x4c) != 0) &&
       (local_48 != (long *)0x0)) {
      *(int *)(local_48 + 2) = (int)local_48[2] + 1;
    }
  }
  while (!bVar2) {
    iVar4 = IOget_array_size_dimen
                      (in_stack_000003f8,in_stack_000003f0,in_stack_000003ec,in_stack_000003e0,
                       in_stack_000003dc);
    if (iVar4 == 0) {
      bVar2 = true;
    }
    else {
      if (str == (char *)0x0) {
        str = (char *)ffs_malloc((size_t)in_stack_ffffffffffffffb0);
      }
      else {
        str = (char *)ffs_realloc(in_stack_ffffffffffffffb0,
                                  CONCAT44(in_stack_ffffffffffffffac,iVar4));
      }
      *(int *)(str + (long)local_2c * 8) = iVar4;
      pcVar6 = str + (long)local_2c * 8 + 4;
      pcVar6[0] = -1;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      if (in_stack_ffffffffffffffac == -1) {
        *(int *)(str + (long)local_2c * 8) = iVar4;
      }
      else {
        *(undefined4 *)(in_RDI + 0x48) = 1;
        *(undefined4 *)(lVar1 + (long)in_ESI * 0x40 + 4) = 1;
        *(int *)(str + (long)local_2c * 8 + 4) = in_stack_ffffffffffffffac;
        pcVar6 = str + (long)local_2c * 8;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
      }
      local_2c = local_2c + 1;
    }
  }
  *(char **)(lVar1 + (long)in_ESI * 0x40 + 0x18) = str;
  *(int *)(lVar1 + (long)in_ESI * 0x40 + 0x10) = local_2c;
  return;
}

Assistant:

static void
gen_var_dimens(FMFormat fmformat, int field)
{
    FMFieldList field_list = fmformat->field_list;
    FMVarInfoList new_var_list = fmformat->var_list;
    const char *typ = field_list[field].field_type;
    int dimen_count = 0;
    int done = 0;
    FMDimen *dimens = NULL;
    FMTypeDesc *tmp, *last;
    if ((!strchr(typ, '*')) && (!strchr(typ, '['))) {
	new_var_list[field].type_desc.next = NULL;
	new_var_list[field].type_desc.type = FMType_simple;
	new_var_list[field].type_desc.field_index = field;
	new_var_list[field].type_desc.data_type = FMstr_to_data_type(typ);
    } else {
	FMTypeDesc *desc = gen_type_desc(fmformat, field, typ);
	new_var_list[field].type_desc = *desc;
	free(desc);
    }
    tmp = &new_var_list[field].type_desc;
    last = NULL;
    while(tmp->next != NULL) {
	if (tmp->type == FMType_pointer) {
	    fmformat->variant = 1;
	}
	last = tmp;
	tmp = tmp->next;
    }
    if (new_var_list[field].data_type == string_type) {
	tmp->type = FMType_string;
    } else if (fmformat->field_subformats[field] != NULL) {
	tmp->type = FMType_subformat;
	tmp->field_index = field;
	if (fmformat->field_subformats[field]->recursive) {
	    if (last) last->pointer_recursive++;
	}
    }
    while (!done) {
	int control_val;
	int static_size = IOget_array_size_dimen(field_list[field].field_type,
						 field_list, dimen_count, 
						 &control_val, field);
	if (static_size == 0) {
	    done++;
	    continue;
	}
	if (dimens == NULL) {
	    dimens = malloc(sizeof(dimens[0]));
	} else {
	    dimens = realloc(dimens, sizeof(dimens[0]) * (dimen_count + 1));
	}
	dimens[dimen_count].static_size = static_size;
	dimens[dimen_count].control_field_index = -1;
	if (control_val != -1) {
	    /* got a variant array */
	    fmformat->variant = 1;
	    new_var_list[field].var_array = 1;
	    dimens[dimen_count].control_field_index = control_val;
	    dimens[dimen_count].static_size = 0;
	} else {
	    dimens[dimen_count].static_size = static_size;
	}
	dimen_count++;
    }
    new_var_list[field].dimens = dimens;
    new_var_list[field].dimen_count = dimen_count;
}